

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

char * ma_result_description(ma_result result)

{
  if (result < MA_MEMORY_ALREADY_MAPPED) {
    if (result < MA_INVALID_DEVICE_CONFIG) {
      switch(result) {
      case MA_FAILED_TO_STOP_BACKEND_DEVICE:
        return "Failed to stop backend device";
      case MA_FAILED_TO_START_BACKEND_DEVICE:
        return "Failed to start backend device";
      case MA_FAILED_TO_OPEN_BACKEND_DEVICE:
        return "Failed to open backend device";
      case MA_FAILED_TO_INIT_BACKEND:
        return "Failed to initialize backend";
      }
      if (result == MA_DEVICE_NOT_STARTED) {
        return "Device not started";
      }
      if (result == MA_DEVICE_NOT_INITIALIZED) {
        return "Device not initialized";
      }
    }
    else {
      switch(result) {
      case MA_INVALID_DEVICE_CONFIG:
        return "Invalid device config";
      case MA_API_NOT_FOUND:
        return "API not found";
      case MA_NO_DEVICE:
        return "No device";
      case MA_NO_BACKEND:
        return "No backend";
      case MA_SHARE_MODE_NOT_SUPPORTED:
        return "Share mode not supported";
      case MA_DEVICE_TYPE_NOT_SUPPORTED:
        return "Device type not supported";
      case MA_FORMAT_NOT_SUPPORTED:
        return "Format not supported";
      }
    }
  }
  else {
    switch(result) {
    case MA_SUCCESS:
      return "No error";
    case MA_MEMORY_ALREADY_MAPPED:
      return "Memory already mapped";
    case MA_CANCELLED:
      return "Operation cancelled";
    case MA_IN_PROGRESS:
      return "Operation in progress";
    case MA_NO_HOST:
      return "No host";
    case MA_CONNECTION_REFUSED:
      return "Connection refused";
    case MA_NOT_CONNECTED:
      return "Not connected";
    case MA_ALREADY_CONNECTED:
      return "Already connected";
    case MA_CONNECTION_RESET:
      return "Connection reset";
    case MA_SOCKET_NOT_SUPPORTED:
      return "Socket type not supported";
    case MA_ADDRESS_FAMILY_NOT_SUPPORTED:
      return "Address family not supported";
    case MA_PROTOCOL_FAMILY_NOT_SUPPORTED:
      return "Protocol family not supported";
    case MA_PROTOCOL_NOT_SUPPORTED:
      return "Protocol not supported";
    case MA_PROTOCOL_UNAVAILABLE:
      return "Protocol not available";
    case MA_BAD_PROTOCOL:
      return "Protocol wrong type for socket";
    case MA_NO_ADDRESS:
      return "Destination address required";
    case MA_NOT_SOCKET:
      return "Socket operation on non-socket";
    case MA_NOT_UNIQUE:
      return "Not unique";
    case MA_NO_NETWORK:
      return "Network unavailable";
    case MA_TIMEOUT:
      return "Timeout";
    case MA_INVALID_DATA:
      return "Invalid data";
    case MA_NO_DATA_AVAILABLE:
      return "No data available";
    case MA_BAD_MESSAGE:
      return "Invalid message";
    case MA_NO_MESSAGE:
      return "No message of desired type";
    case MA_NOT_IMPLEMENTED:
      return "Not implemented";
    case MA_TOO_MANY_LINKS:
      return "Too many links";
    case MA_DEADLOCK:
      return "Deadlock";
    case MA_BAD_PIPE:
      return "Broken pipe";
    case MA_BAD_SEEK:
      return "Illegal seek";
    case MA_BAD_ADDRESS:
      return "Bad address";
    case MA_ALREADY_IN_USE:
      return "Resource already in use";
    case MA_UNAVAILABLE:
      return "Resource unavailable";
    case MA_INTERRUPT:
      return "Interrupted";
    case MA_IO_ERROR:
      return "Input/output error";
    case MA_BUSY:
      return "Device or resource busy";
    case MA_NO_SPACE:
      return "No space available";
    case MA_AT_END:
      return "At end";
    case MA_DIRECTORY_NOT_EMPTY:
      return "Directory not empty";
    case MA_IS_DIRECTORY:
      return "Is a directory";
    case MA_NOT_DIRECTORY:
      return "Not a directory";
    case MA_NAME_TOO_LONG:
      return "Name too long";
    case MA_PATH_TOO_LONG:
      return "Path too long";
    case MA_TOO_BIG:
      return "Too large";
    case MA_INVALID_FILE:
      return "Invalid file";
    case MA_TOO_MANY_OPEN_FILES:
      return "Too many open files";
    case MA_ALREADY_EXISTS:
      return "Resource already exists";
    case MA_DOES_NOT_EXIST:
      return "Resource does not exist";
    case MA_ACCESS_DENIED:
      return "Permission denied";
    case MA_OUT_OF_RANGE:
      return "Out of range";
    case MA_OUT_OF_MEMORY:
      return "Out of memory";
    case MA_INVALID_OPERATION:
      return "Invalid operation";
    case MA_INVALID_ARGS:
      return "Invalid argument";
    }
  }
  return "Unknown error";
}

Assistant:

MA_API const char* ma_result_description(ma_result result)
{
    switch (result)
    {
        case MA_SUCCESS:                       return "No error";
        case MA_ERROR:                         return "Unknown error";
        case MA_INVALID_ARGS:                  return "Invalid argument";
        case MA_INVALID_OPERATION:             return "Invalid operation";
        case MA_OUT_OF_MEMORY:                 return "Out of memory";
        case MA_OUT_OF_RANGE:                  return "Out of range";
        case MA_ACCESS_DENIED:                 return "Permission denied";
        case MA_DOES_NOT_EXIST:                return "Resource does not exist";
        case MA_ALREADY_EXISTS:                return "Resource already exists";
        case MA_TOO_MANY_OPEN_FILES:           return "Too many open files";
        case MA_INVALID_FILE:                  return "Invalid file";
        case MA_TOO_BIG:                       return "Too large";
        case MA_PATH_TOO_LONG:                 return "Path too long";
        case MA_NAME_TOO_LONG:                 return "Name too long";
        case MA_NOT_DIRECTORY:                 return "Not a directory";
        case MA_IS_DIRECTORY:                  return "Is a directory";
        case MA_DIRECTORY_NOT_EMPTY:           return "Directory not empty";
        case MA_AT_END:                        return "At end";
        case MA_NO_SPACE:                      return "No space available";
        case MA_BUSY:                          return "Device or resource busy";
        case MA_IO_ERROR:                      return "Input/output error";
        case MA_INTERRUPT:                     return "Interrupted";
        case MA_UNAVAILABLE:                   return "Resource unavailable";
        case MA_ALREADY_IN_USE:                return "Resource already in use";
        case MA_BAD_ADDRESS:                   return "Bad address";
        case MA_BAD_SEEK:                      return "Illegal seek";
        case MA_BAD_PIPE:                      return "Broken pipe";
        case MA_DEADLOCK:                      return "Deadlock";
        case MA_TOO_MANY_LINKS:                return "Too many links";
        case MA_NOT_IMPLEMENTED:               return "Not implemented";
        case MA_NO_MESSAGE:                    return "No message of desired type";
        case MA_BAD_MESSAGE:                   return "Invalid message";
        case MA_NO_DATA_AVAILABLE:             return "No data available";
        case MA_INVALID_DATA:                  return "Invalid data";
        case MA_TIMEOUT:                       return "Timeout";
        case MA_NO_NETWORK:                    return "Network unavailable";
        case MA_NOT_UNIQUE:                    return "Not unique";
        case MA_NOT_SOCKET:                    return "Socket operation on non-socket";
        case MA_NO_ADDRESS:                    return "Destination address required";
        case MA_BAD_PROTOCOL:                  return "Protocol wrong type for socket";
        case MA_PROTOCOL_UNAVAILABLE:          return "Protocol not available";
        case MA_PROTOCOL_NOT_SUPPORTED:        return "Protocol not supported";
        case MA_PROTOCOL_FAMILY_NOT_SUPPORTED: return "Protocol family not supported";
        case MA_ADDRESS_FAMILY_NOT_SUPPORTED:  return "Address family not supported";
        case MA_SOCKET_NOT_SUPPORTED:          return "Socket type not supported";
        case MA_CONNECTION_RESET:              return "Connection reset";
        case MA_ALREADY_CONNECTED:             return "Already connected";
        case MA_NOT_CONNECTED:                 return "Not connected";
        case MA_CONNECTION_REFUSED:            return "Connection refused";
        case MA_NO_HOST:                       return "No host";
        case MA_IN_PROGRESS:                   return "Operation in progress";
        case MA_CANCELLED:                     return "Operation cancelled";
        case MA_MEMORY_ALREADY_MAPPED:         return "Memory already mapped";

        case MA_FORMAT_NOT_SUPPORTED:          return "Format not supported";
        case MA_DEVICE_TYPE_NOT_SUPPORTED:     return "Device type not supported";
        case MA_SHARE_MODE_NOT_SUPPORTED:      return "Share mode not supported";
        case MA_NO_BACKEND:                    return "No backend";
        case MA_NO_DEVICE:                     return "No device";
        case MA_API_NOT_FOUND:                 return "API not found";
        case MA_INVALID_DEVICE_CONFIG:         return "Invalid device config";

        case MA_DEVICE_NOT_INITIALIZED:        return "Device not initialized";
        case MA_DEVICE_NOT_STARTED:            return "Device not started";

        case MA_FAILED_TO_INIT_BACKEND:        return "Failed to initialize backend";
        case MA_FAILED_TO_OPEN_BACKEND_DEVICE: return "Failed to open backend device";
        case MA_FAILED_TO_START_BACKEND_DEVICE: return "Failed to start backend device";
        case MA_FAILED_TO_STOP_BACKEND_DEVICE: return "Failed to stop backend device";

        default:                               return "Unknown error";
    }
}